

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O0

XercesAttGroupInfo * __thiscall
xercesc_4_0::TraverseSchema::traverseAttributeGroupDeclNS
          (TraverseSchema *this,DOMElement *elem,XMLCh *uriStr,XMLCh *name)

{
  int iVar1;
  SchemaGrammar *this_00;
  RefHashTableOf<xercesc_4_0::XercesAttGroupInfo,_xercesc_4_0::StringHasher> *this_01;
  XercesAttGroupInfo *attGroupInfo;
  Grammar *aGrammar;
  NamespaceScopeManager nsMgr;
  XMLCh *name_local;
  XMLCh *uriStr_local;
  DOMElement *elem_local;
  TraverseSchema *this_local;
  
  nsMgr.fSchemaInfo = (SchemaInfo *)name;
  NamespaceScopeManager::NamespaceScopeManager
            ((NamespaceScopeManager *)&aGrammar,elem,this->fSchemaInfo,this);
  this_00 = (SchemaGrammar *)GrammarResolver::getGrammar(this->fGrammarResolver,uriStr);
  if (this_00 != (SchemaGrammar *)0x0) {
    iVar1 = (*(this_00->super_Grammar).super_XSerializable._vptr_XSerializable[5])();
    if (iVar1 == 1) {
      this_01 = SchemaGrammar::getAttGroupInfoRegistry(this_00);
      this_local = (TraverseSchema *)
                   RefHashTableOf<xercesc_4_0::XercesAttGroupInfo,_xercesc_4_0::StringHasher>::get
                             (this_01,nsMgr.fSchemaInfo);
      goto LAB_004449e7;
    }
  }
  reportSchemaError(this,elem,(XMLCh *)XMLUni::fgValidityDomain,0x26,uriStr,(XMLCh *)0x0,
                    (XMLCh *)0x0,(XMLCh *)0x0);
  this_local = (TraverseSchema *)0x0;
LAB_004449e7:
  NamespaceScopeManager::~NamespaceScopeManager((NamespaceScopeManager *)&aGrammar);
  return (XercesAttGroupInfo *)this_local;
}

Assistant:

inline XercesAttGroupInfo*
TraverseSchema::traverseAttributeGroupDeclNS(const DOMElement* const elem,
                                             const XMLCh* const uriStr,
                                             const XMLCh* const name) {

    NamespaceScopeManager nsMgr(elem, fSchemaInfo, this);

    // ------------------------------------------------------------------
    // Get grammar information
    // ------------------------------------------------------------------
    Grammar* aGrammar = fGrammarResolver->getGrammar(uriStr);

    if (!aGrammar || aGrammar->getGrammarType() != Grammar::SchemaGrammarType) {

        reportSchemaError(elem, XMLUni::fgValidityDomain, XMLValid::GrammarNotFound, uriStr);
        return 0;
    }

    XercesAttGroupInfo* attGroupInfo = ((SchemaGrammar*)aGrammar)->getAttGroupInfoRegistry()->get(name);

    return attGroupInfo;
}